

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportingbase.cpp
# Opt level: O2

void __thiscall trun::ResultsReportPinterBase::Begin(ResultsReportPinterBase *this)

{
  FILE *__stream;
  bool bVar1;
  Config *pCVar2;
  FILE *pFVar3;
  
  pCVar2 = Config::Instance();
  bVar1 = std::operator==(&pCVar2->reportFile,"-");
  if (!bVar1) {
    pCVar2 = Config::Instance();
    pFVar3 = fopen((pCVar2->reportFile)._M_dataplus._M_p,"w+");
    this->fout = (FILE *)pFVar3;
    __stream = _stderr;
    if (pFVar3 != (FILE *)0x0) {
      return;
    }
    pCVar2 = Config::Instance();
    fprintf(__stream,"Err: unable to create report file \'%s\'\n",
            (pCVar2->reportFile)._M_dataplus._M_p);
  }
  this->fout = _stdout;
  return;
}

Assistant:

void ResultsReportPinterBase::Begin() {
    if (Config::Instance().reportFile == "-") {
        fout = stdout;
    } else {
#ifndef TRUN_EMBEDDED_MCU
        fout = fopen(Config::Instance().reportFile.c_str(), "w+");
        if (fout == nullptr) {
            fprintf(stderr, "Err: unable to create report file '%s'\n", Config::Instance().reportFile.c_str());
            fout = stdout;
        }
#else
        fout = stdout;
#endif
    }
}